

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int hdr_percentiles_print
              (hdr_histogram *h,FILE *stream,int32_t ticks_per_half_distance,double value_scale,
              format_type format)

{
  char cVar1;
  int iVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  char line_format [25];
  hdr_histogram *local_b0;
  undefined4 local_a8;
  int64_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  long lStack_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  int32_t local_54;
  undefined8 local_50;
  double dStack_48;
  code *local_38;
  
  if ((format == CLASSIC) || (format != CSV)) {
    pcVar4 = "%12.";
    pcVar5 = "f %12f %12d %12.2f\n";
  }
  else {
    pcVar4 = "%.";
    pcVar5 = "f,%f,%d,%.2f\n";
  }
  snprintf(line_format,0x19,"%s%d%s",pcVar4,(ulong)(uint)h->significant_figures,pcVar5);
  pcVar4 = "%12s %12s %12s %12s\n\n";
  if (format == CSV) {
    pcVar4 = "%s,%s,%s,%s\n";
  }
  local_a8 = 0xffffffff;
  local_a0 = h->total_count;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  lStack_80 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_50 = 0;
  dStack_48 = 0.0;
  local_38 = percentile_iter_next;
  local_b0 = h;
  local_54 = ticks_per_half_distance;
  iVar2 = fprintf((FILE *)stream,pcVar4,"Value","Percentile","TotalCount","1/(1-Percentile)");
  if (-1 < iVar2) {
    do {
      cVar1 = (*local_38)(&local_b0);
      if (cVar1 == '\0') {
        if (format != CLASSIC) {
          return 0;
        }
        dVar6 = hdr_mean(h);
        dVar7 = hdr_stddev(h);
        iVar3 = hdr_max(h);
        iVar2 = fprintf((FILE *)stream,
                        "#[Mean    = %12.3f, StdDeviation   = %12.3f]\n#[Max     = %12.3f, Total count    = %12lu]\n#[Buckets = %12d, SubBuckets     = %12d]\n"
                        ,dVar6 / value_scale,dVar7 / value_scale,(double)iVar3 / value_scale,
                        h->total_count,(ulong)(uint)h->bucket_count,(ulong)(uint)h->sub_bucket_count
                       );
        if (iVar2 < 0) {
          return 5;
        }
        return 0;
      }
      iVar2 = fprintf((FILE *)stream,line_format,(double)lStack_80 / value_scale,dStack_48 / 100.0,
                      1.0 / (1.0 - dStack_48 / 100.0),uStack_90);
    } while (-1 < iVar2);
  }
  return 5;
}

Assistant:

int hdr_percentiles_print(
        struct hdr_histogram* h, FILE* stream, int32_t ticks_per_half_distance,
        double value_scale, format_type format)
{
    char line_format[25];
    const char* head_format;
    int rc = 0;
    struct hdr_iter iter;
    struct hdr_iter_percentiles * percentiles;

    format_line_string(line_format, 25, h->significant_figures, format);
    head_format = format_head_string(format);

    hdr_iter_percentile_init(&iter, h, ticks_per_half_distance);

    if (fprintf(
            stream, head_format,
            "Value", "Percentile", "TotalCount", "1/(1-Percentile)") < 0)
    {
        rc = EIO;
        goto cleanup;
    }

    percentiles = &iter.specifics.percentiles;
    while (hdr_iter_next(&iter))
    {
        double  value               = iter.highest_equivalent_value / value_scale;
        double  percentile          = percentiles->percentile / 100.0;
        int64_t total_count         = iter.cumulative_count;
        double  inverted_percentile = (1.0 / (1.0 - percentile));

        if (fprintf(
                stream, line_format, value, percentile, total_count, inverted_percentile) < 0)
        {
            rc = EIO;
            goto cleanup;
        }
    }

    if (CLASSIC == format)
    {
        double mean   = hdr_mean(h)   / value_scale;
        double stddev = hdr_stddev(h) / value_scale;
        double max    = hdr_max(h)    / value_scale;

        if (fprintf(
                stream, CLASSIC_FOOTER,  mean, stddev, max,
                h->total_count, h->bucket_count, h->sub_bucket_count) < 0)
        {
            rc = EIO;
            goto cleanup;
        }
    }

    cleanup:
    return rc;
}